

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

tensor * __thiscall
dlib::tensor::operator=
          (tensor *this,
          matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          *item)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  ostream *poVar10;
  fatal_error *this_00;
  long lVar11;
  long lVar12;
  long lVar13;
  ostringstream dlib_o_out;
  string local_1b0;
  long local_190 [3];
  uint auStack_178 [88];
  
  if ((this->m_n == *(long *)(item + 8)) &&
     (this->m_nc * this->m_nr * this->m_k - *(long *)(item + 0x10) == 0)) {
    iVar8 = (*this->_vptr_tensor[4])(this);
    lVar9 = CONCAT44(extraout_var,iVar8);
    lVar2 = *(long *)(item + 8);
    if (0 < lVar2) {
      lVar3 = this->m_nr;
      lVar4 = *(long *)(item + 0x10);
      lVar11 = 0;
      lVar12 = 0;
      lVar5 = this->m_nc;
      lVar6 = this->m_k;
      do {
        if (0 < lVar4) {
          lVar7 = *(long *)item;
          lVar13 = 0;
          do {
            *(undefined4 *)(lVar9 + lVar13 * 4) = *(undefined4 *)(lVar7 + lVar11 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar4 != lVar13);
        }
        lVar12 = lVar12 + 1;
        lVar9 = lVar9 + lVar3 * lVar5 * lVar6 * 4;
        lVar11 = lVar11 + lVar4 * 4;
      } while (lVar12 != lVar2);
    }
    return this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x79);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
             ,0x73);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "tensor &dlib::tensor::operator=(const matrix_exp<EXP> &) [EXP = dlib::matrix<float>]",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"num_samples() == item.nr() && nr()*nc()*k() == item.nc()",0x38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

long long nc() const { return m_nc; }